

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_udmf.cpp
# Opt level: O1

void __thiscall UDMFParser::ParseLinedef(UDMFParser *this,line_t_conflict *ld,int index)

{
  byte *pbVar1;
  uint32_t *puVar2;
  uint uVar3;
  char *__s1;
  DWORD DVar4;
  side_t **ppsVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  long lVar11;
  uint32_t *puVar12;
  FString *this_00;
  FString tagstring;
  FString arg1str;
  FString arg0str;
  FName key;
  FString local_178;
  FString local_170;
  FString local_168;
  FString local_160;
  FName local_154;
  ulong local_150;
  ulong local_148;
  ulong local_140;
  side_t **local_138;
  FScanner local_130;
  ulong uVar10;
  
  local_168.Chars = FString::NullString.Nothing;
  local_170.Chars = FString::NullString.Nothing;
  local_178.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  memset(ld,0,0x98);
  ld->alpha = 1.0;
  ld->portalindex = 0xffffffff;
  ld->sidedef[0] = (side_t *)0x0;
  ld->sidedef[1] = (side_t *)0x0;
  DVar4 = level.flags2;
  if ((level.flags2 >> 9 & 1) != 0) {
    pbVar1 = (byte *)((long)&ld->flags + 2);
    *pbVar1 = *pbVar1 | 8;
  }
  if ((DVar4 >> 10 & 1) != 0) {
    pbVar1 = (byte *)((long)&ld->flags + 2);
    *pbVar1 = *pbVar1 | 0x10;
  }
  if ((DVar4 >> 0xb & 1) != 0) {
    pbVar1 = (byte *)((long)&ld->flags + 2);
    *pbVar1 = *pbVar1 | 0x40;
  }
  FScanner::MustGetToken((FScanner *)this,0x7b);
  local_138 = ld->sidedef;
  puVar2 = &ld->activation;
  local_140 = 0;
  local_150 = 0;
  local_148 = 0;
LAB_00461dd6:
  bVar6 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar6) {
    if (((FNullStringData *)(local_178.Chars + -0xc))->Len != 0) {
      FScanner::FScanner(&local_130);
      FString::AttachToOther(&local_160,&local_178);
      FScanner::OpenString(&local_130,"tagstring",&local_160);
      FString::~FString(&local_160);
      while (bVar6 = FScanner::CheckNumber(&local_130), bVar6) {
        if (local_130.Number != 0) {
          FTagManager::AddLineID(&tagManager,index,local_130.Number);
        }
      }
      FScanner::~FScanner(&local_130);
    }
    ppsVar5 = local_138;
    if (this->isTranslated == true) {
      uVar3 = ld->flags;
      local_130._10_4_ = 0;
      local_130.String._0_4_ = 0;
      local_130.String._4_2_ = 0;
      local_130.String._6_2_ = (undefined2)ld->special;
      local_130.StringLen._0_2_ = (undefined2)ld->args[0];
      P_TranslateLineDef((line_t *)ld,(maplinedef_t *)&local_130,-1);
      ld->flags = ld->flags & 0x802200 | uVar3;
    }
    if (((local_148 & 1) != 0) && ((ld->activation & 2) != 0)) {
      ld->activation = ld->activation & 0xffffffbd | 0x40;
    }
    if ((((local_150 & 1) != 0) && (ld->alpha == 1.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.75;
    }
    if ((((local_140 & 1) != 0) && (ld->alpha == 65536.0)) && (!NAN(ld->alpha))) {
      ld->alpha = 0.25;
    }
    if (*ppsVar5 == (side_t *)0x0) {
      *ppsVar5 = (side_t *)0x1;
      Printf("Line %d has no first side.\n",(ulong)(uint)index);
    }
    if (((ulong)((FNullStringData *)(local_168.Chars + -0xc))->Len != 0) &&
       (((iVar9 = ld->special, iVar9 - 0x50U < 6 || (iVar9 == 0xe2)) || (iVar9 == 0)))) {
      iVar9 = FName::NameManager::FindName
                        (&FName::NameData,local_168.Chars,
                         (ulong)((FNullStringData *)(local_168.Chars + -0xc))->Len,false);
      ld->args[0] = -iVar9;
    }
    if ((ulong)((FNullStringData *)(local_170.Chars + -0xc))->Len != 0) {
      uVar3 = ld->special - 0x86;
      if (((uVar3 < 0x2d) && ((0x12000000002fU >> ((ulong)uVar3 & 0x3f) & 1) != 0)) ||
         (ld->special == 0)) {
        iVar9 = FName::NameManager::FindName
                          (&FName::NameData,local_170.Chars,
                           (ulong)((FNullStringData *)(local_170.Chars + -0xc))->Len,false);
        ld->args[1] = -iVar9;
      }
    }
    if ((ld->flags & 0x10200000) == 0x10000000) {
      Printf("Line %d has midtex3dimpassible without midtex3d.\n",(ulong)(uint)index);
    }
    FString::~FString(&local_178);
    FString::~FString(&local_170);
    FString::~FString(&local_168);
    return;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&local_130,SUB81(this,0),(bool *)0x0);
  iVar9 = (int)local_130.String;
  lVar11 = (long)(int)local_130.String;
  iVar8 = 1;
  if (lVar11 < 0x168) {
    switch((int)local_130.String) {
    case 0x118:
    case 0x119:
    case 0x11a:
    case 0x11b:
    case 0x11c:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
      }
      *(int *)((long)ld + lVar11 * 4 + -0x434) = (this->super_UDMFParserBase).sc.Number;
      goto LAB_00461dd6;
    case 0x11d:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) == 0) break;
      this_00 = &local_168;
      if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"String value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
        this_00 = &local_168;
      }
LAB_00461fd1:
      FString::operator=(this_00,(this->super_UDMFParserBase).parsedString.Chars);
      goto LAB_00461dd6;
    case 0x11e:
      if (((this->super_UDMFParserBase).namespace_bits & 0x10) != 0) {
        this_00 = &local_170;
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar11].Text);
          this_00 = &local_170;
        }
        goto LAB_00461fd1;
      }
      break;
    case 0x11f:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
      }
      FTagManager::AddLineID(&tagManager,index,(this->super_UDMFParserBase).sc.Number);
      goto LAB_00461dd6;
    case 0x120:
      break;
    case 0x121:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
      }
      ld->v1 = (vertex_t *)(long)(this->super_UDMFParserBase).sc.Number;
      goto LAB_00461dd6;
    case 0x122:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
      }
      ld->v2 = (vertex_t *)(long)(this->super_UDMFParserBase).sc.Number;
      goto LAB_00461dd6;
    case 0x123:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
      }
      *local_138 = (side_t *)((long)(this->super_UDMFParserBase).sc.Number + 1);
      goto LAB_00461dd6;
    case 0x124:
      if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Integer value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
      }
      ld->sidedef[1] = (side_t *)((long)(this->super_UDMFParserBase).sc.Number + 1);
      goto LAB_00461dd6;
    default:
      if ((int)local_130.String == 0xed) {
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar11].Text);
        }
        uVar3 = (this->super_UDMFParserBase).sc.Number;
        ld->special = uVar3;
        if (((this->super_UDMFParserBase).namespc.Index == 10) &&
           ((0x8c < uVar3 || ("\x01\x01\x01\x01\x01\x01\x01\x01\x01"[uVar3] == '\0')))) {
          ld->special = 0;
        }
        goto LAB_00461dd6;
      }
      if (((int)local_130.String == 0x159) &&
         (((this->super_UDMFParserBase).namespace_bits & 0x78) != 0)) {
        uVar3 = (this->super_UDMFParserBase).sc.TokenType;
        uVar7 = uVar3 & 0xfffffffe;
        uVar10 = (ulong)uVar7;
        if (uVar7 != 0x150) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Boolean value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar11].Text);
          uVar10 = extraout_RAX;
        }
        local_150 = CONCAT71((int7)(uVar10 >> 8),uVar3 == 0x150);
        goto LAB_00461dd6;
      }
    }
switchD_00461e26_caseD_120:
    puVar12 = puVar2;
    if (this->isTranslated == false) {
      iVar8 = 1;
      switch((int)local_130.String) {
      case 0x17e:
        iVar8 = 0x200;
        goto switchD_00461e81_caseD_168;
      default:
        goto switchD_00462262_caseD_17f;
      case 0x182:
        break;
      case 0x183:
        iVar8 = 2;
        break;
      case 0x184:
        iVar8 = 0x400;
        break;
      case 0x185:
        iVar8 = 4;
        break;
      case 0x186:
        iVar8 = 8;
        break;
      case 0x187:
        iVar8 = 0x10;
        break;
      case 0x188:
        iVar8 = 0x20;
        break;
      case 0x18a:
        iVar8 = 0x100;
        break;
      case 0x18b:
        iVar8 = 0x200;
      }
      goto switchD_00462262_caseD_182;
    }
switchD_00462262_caseD_17f:
    if (((this->super_UDMFParserBase).namespace_bits & 0x70) == 0) goto switchD_00462233_caseD_175;
    if ((int)local_130.String < 0x1c8) {
      switch((int)local_130.String) {
      case 0x171:
        iVar8 = 0x2000;
        break;
      case 0x172:
        iVar8 = 0x4000;
        break;
      case 0x173:
        iVar8 = 0x8000;
        break;
      case 0x174:
        iVar8 = 0x10000;
        break;
      case 0x175:
      case 0x176:
      case 0x17c:
      case 0x17d:
      case 0x17e:
      case 0x17f:
      case 0x182:
      case 0x183:
      case 0x184:
      case 0x185:
      case 0x186:
      case 0x187:
      case 0x188:
        goto switchD_00462233_caseD_175;
      case 0x177:
        iVar8 = 0x80000;
        break;
      case 0x178:
        iVar8 = 0x100000;
        break;
      case 0x179:
        iVar8 = 0x200000;
        break;
      case 0x17a:
        iVar8 = 0x400000;
        break;
      case 0x17b:
        iVar8 = 0x800000;
        break;
      case 0x180:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x104) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Integer value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar11].Text);
        }
        ld->locknumber = (this->super_UDMFParserBase).sc.Number;
        goto LAB_00461dd6;
      case 0x181:
        iVar8 = 0x10000000;
        break;
      case 0x189:
        iVar8 = 0x80;
        goto switchD_00462262_caseD_182;
      default:
        if ((int)local_130.String == 0xe6) {
          if (((this->super_UDMFParserBase).sc.TokenType | 2U) != 0x106) {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Floating point value expected for key \'%s\'",
                       FName::NameData.NameArray[lVar11].Text);
          }
          ld->alpha = (this->super_UDMFParserBase).sc.Float;
        }
        else {
          if ((int)local_130.String == 0x120) {
            if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
              FScanner::ScriptMessage
                        ((FScanner *)this,"String value expected for key \'%s\'",
                         FName::NameData.NameArray[lVar11].Text);
            }
            FString::operator=(&local_178,(this->super_UDMFParserBase).parsedString.Chars);
          }
switchD_00462233_caseD_175:
          if ((((this->super_UDMFParserBase).namespace_bits & 0x30) != 0) &&
             (iVar8 = strncasecmp("user_",FName::NameData.NameArray[lVar11].Text,5), iVar8 == 0)) {
            local_154.Index = iVar9;
            AddUserKey(this,&local_154,0,index);
          }
        }
        goto LAB_00461dd6;
      }
    }
    else {
      switch((int)local_130.String) {
      case 0x1c8:
        iVar8 = 0x1000000;
        break;
      case 0x1c9:
        iVar8 = 0x2000000;
        break;
      default:
        goto switchD_00462233_caseD_175;
      case 0x1cb:
        iVar8 = 0x4000000;
        break;
      case 0x1cc:
        iVar8 = 0x8000000;
        break;
      case 0x1cd:
        if ((this->super_UDMFParserBase).sc.TokenType != 0x102) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"String value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar11].Text);
        }
        __s1 = (this->super_UDMFParserBase).parsedString.Chars;
        iVar9 = strcasecmp(__s1,"translucent");
        if (iVar9 == 0) {
          pbVar1 = (byte *)((long)&ld->flags + 1);
          *pbVar1 = *pbVar1 & 0xfb;
        }
        else {
          iVar9 = strcasecmp(__s1,"add");
          if (iVar9 == 0) {
            pbVar1 = (byte *)((long)&ld->flags + 1);
            *pbVar1 = *pbVar1 | 4;
          }
          else {
            FScanner::ScriptMessage
                      ((FScanner *)this,"Unknown value \"%s\" for \'renderstyle\'\n",__s1);
          }
        }
        goto LAB_00461dd6;
      }
    }
  }
  else {
    switch((int)local_130.String) {
    case 0x168:
      break;
    case 0x169:
      iVar8 = 2;
      break;
    case 0x16a:
      iVar8 = 4;
      break;
    case 0x16b:
      iVar8 = 8;
      break;
    case 0x16c:
      iVar8 = 0x10;
      break;
    case 0x16d:
      iVar8 = 0x20;
      break;
    case 0x16e:
      iVar8 = 0x40;
      break;
    case 0x16f:
      iVar8 = 0x80;
      break;
    case 0x170:
      iVar8 = 0x100;
      break;
    default:
      goto switchD_00461e26_caseD_120;
    case 0x175:
      iVar8 = 0x20000;
      goto LAB_0046218e;
    case 0x176:
      iVar8 = 0x40000;
LAB_0046218e:
      puVar12 = &ld->flags;
      if (((this->super_UDMFParserBase).namespace_bits & 0x78) == 0)
      goto switchD_00461e26_caseD_120;
      goto switchD_00462262_caseD_182;
    case 0x17c:
      if (((this->super_UDMFParserBase).namespace_bits & 0x78) != 0) {
        uVar3 = (this->super_UDMFParserBase).sc.TokenType;
        uVar7 = uVar3 & 0xfffffffe;
        uVar10 = (ulong)uVar7;
        if (uVar7 != 0x150) {
          FScanner::ScriptMessage
                    ((FScanner *)this,"Boolean value expected for key \'%s\'",
                     FName::NameData.NameArray[lVar11].Text);
          uVar10 = extraout_RAX_01;
        }
        local_140 = CONCAT71((int7)(uVar10 >> 8),uVar3 == 0x150);
        goto LAB_00461dd6;
      }
      goto switchD_00461e26_caseD_120;
    case 0x17d:
      if (((this->super_UDMFParserBase).namespace_bits & 0x71) == 0)
      goto switchD_00461e26_caseD_120;
      uVar3 = (this->super_UDMFParserBase).sc.TokenType;
      uVar7 = uVar3 & 0xfffffffe;
      uVar10 = (ulong)uVar7;
      if (uVar7 != 0x150) {
        FScanner::ScriptMessage
                  ((FScanner *)this,"Boolean value expected for key \'%s\'",
                   FName::NameData.NameArray[lVar11].Text);
        uVar10 = extraout_RAX_00;
      }
      local_148 = CONCAT71((int7)(uVar10 >> 8),uVar3 == 0x150);
      goto LAB_00461dd6;
    }
  }
switchD_00461e81_caseD_168:
  puVar12 = &ld->flags;
switchD_00462262_caseD_182:
  UDMFParserBase::Flag<unsigned_int>
            (&this->super_UDMFParserBase,puVar12,iVar8,FName::NameData.NameArray[lVar11].Text);
  goto LAB_00461dd6;
}

Assistant:

void ParseLinedef(line_t *ld, int index)
	{
		bool passuse = false;
		bool strifetrans = false;
		bool strifetrans2 = false;
		FString arg0str, arg1str;
		int lineid = -1;	// forZDoomTranslated namespace
		FString tagstring;

		memset(ld, 0, sizeof(*ld));
		ld->alpha = 1.;
		ld->portalindex = UINT_MAX;
		ld->sidedef[0] = ld->sidedef[1] = NULL;
		if (level.flags2 & LEVEL2_CLIPMIDTEX) ld->flags |= ML_CLIP_MIDTEX;
		if (level.flags2 & LEVEL2_WRAPMIDTEX) ld->flags |= ML_WRAP_MIDTEX;
		if (level.flags2 & LEVEL2_CHECKSWITCHRANGE) ld->flags |= ML_CHECKSWITCHRANGE;

		sc.MustGetToken('{');
		while (!sc.CheckToken('}'))
		{
			FName key = ParseKey();

			// This switch contains all keys of the UDMF base spec
			switch(key)
			{
			case NAME_V1:
				ld->v1 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_V2:
				ld->v2 = (vertex_t*)(intptr_t)CheckInt(key);	// must be relocated later
				continue;

			case NAME_Special:
				ld->special = CheckInt(key);
				if (namespc == NAME_Hexen)
				{
					if (ld->special < 0 || ld->special > 140 || !HexenLineSpecialOk[ld->special])
						ld->special = 0;	// NULL all specials which don't exist in Hexen
				}

				continue;

			case NAME_Id:
				lineid = CheckInt(key);
				tagManager.AddLineID(index, lineid);
				continue;

			case NAME_Sidefront:
				ld->sidedef[0] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Sideback:
				ld->sidedef[1] = (side_t*)(intptr_t)(1 + CheckInt(key));
				continue;

			case NAME_Arg0:
			case NAME_Arg1:
			case NAME_Arg2:
			case NAME_Arg3:
			case NAME_Arg4:
				ld->args[int(key)-int(NAME_Arg0)] = CheckInt(key);
				continue;

			case NAME_Arg0Str:
				CHECK_N(Zd);
				arg0str = CheckString(key);
				continue;

			case NAME_Arg1Str:
				CHECK_N(Zd);
				arg1str = CheckString(key);
				continue;

			case NAME_Blocking:
				Flag(ld->flags, ML_BLOCKING, key); 
				continue;

			case NAME_Blockmonsters:
				Flag(ld->flags, ML_BLOCKMONSTERS, key); 
				continue;

			case NAME_Twosided:
				Flag(ld->flags, ML_TWOSIDED, key); 
				continue;

			case NAME_Dontpegtop:
				Flag(ld->flags, ML_DONTPEGTOP, key); 
				continue;

			case NAME_Dontpegbottom:
				Flag(ld->flags, ML_DONTPEGBOTTOM, key); 
				continue;

			case NAME_Secret:
				Flag(ld->flags, ML_SECRET, key); 
				continue;

			case NAME_Blocksound:
				Flag(ld->flags, ML_SOUNDBLOCK, key); 
				continue;

			case NAME_Dontdraw:
				Flag(ld->flags, ML_DONTDRAW, key); 
				continue;

			case NAME_Mapped:
				Flag(ld->flags, ML_MAPPED, key); 
				continue;

			case NAME_Jumpover:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_RAILING, key); 
				continue;

			case NAME_Blockfloaters:
				CHECK_N(St | Zd | Zdt | Va)
				Flag(ld->flags, ML_BLOCK_FLOATERS, key); 
				continue;

			case NAME_Translucent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans = CheckBool(key); 
				continue;

			case NAME_Transparent:
				CHECK_N(St | Zd | Zdt | Va)
				strifetrans2 = CheckBool(key); 
				continue;

			case NAME_Passuse:
				CHECK_N(Dm | Zd | Zdt | Va)
				passuse = CheckBool(key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys of the UDMF base spec which only apply to Hexen format specials
			if (!isTranslated) switch (key)
			{
			case NAME_Playercross:
				Flag(ld->activation, SPAC_Cross, key); 
				continue;

			case NAME_Playeruse:
				Flag(ld->activation, SPAC_Use, key); 
				continue;

			case NAME_Playeruseback:
				Flag(ld->activation, SPAC_UseBack, key); 
				continue;

			case NAME_Monstercross:
				Flag(ld->activation, SPAC_MCross, key); 
				continue;

			case NAME_Impact:
				Flag(ld->activation, SPAC_Impact, key); 
				continue;

			case NAME_Playerpush:
				Flag(ld->activation, SPAC_Push, key); 
				continue;

			case NAME_Missilecross:
				Flag(ld->activation, SPAC_PCross, key); 
				continue;

			case NAME_Monsteruse:
				Flag(ld->activation, SPAC_MUse, key); 
				continue;

			case NAME_Monsterpush:
				Flag(ld->activation, SPAC_MPush, key); 
				continue;

			case NAME_Repeatspecial:
				Flag(ld->flags, ML_REPEAT_SPECIAL, key); 
				continue;

			default:
				break;
			}

			// This switch contains all keys which are ZDoom specific
			if (namespace_bits & (Zd|Zdt|Va)) switch(key)
			{
			case NAME_Alpha:
				ld->setAlpha(CheckFloat(key));
				continue;

			case NAME_Renderstyle:
			{
				const char *str = CheckString(key);
				if (!stricmp(str, "translucent")) ld->flags &= ~ML_ADDTRANS;
				else if (!stricmp(str, "add")) ld->flags |= ML_ADDTRANS;
				else sc.ScriptMessage("Unknown value \"%s\" for 'renderstyle'\n", str);
				continue;
			}

			case NAME_Anycross:
				Flag(ld->activation, SPAC_AnyCross, key); 
				continue;

			case NAME_Monsteractivate:
				Flag(ld->flags, ML_MONSTERSCANACTIVATE, key); 
				continue;

			case NAME_Blockplayers:
				Flag(ld->flags, ML_BLOCK_PLAYERS, key); 
				continue;

			case NAME_Blockeverything:
				Flag(ld->flags, ML_BLOCKEVERYTHING, key); 
				continue;

			case NAME_Zoneboundary:
				Flag(ld->flags, ML_ZONEBOUNDARY, key); 
				continue;

			case NAME_Clipmidtex:
				Flag(ld->flags, ML_CLIP_MIDTEX, key); 
				continue;

			case NAME_Wrapmidtex:
				Flag(ld->flags, ML_WRAP_MIDTEX, key); 
				continue;

			case NAME_Midtex3d:
				Flag(ld->flags, ML_3DMIDTEX, key); 
				continue;

			case NAME_Checkswitchrange:
				Flag(ld->flags, ML_CHECKSWITCHRANGE, key); 
				continue;

			case NAME_Firstsideonly:
				Flag(ld->flags, ML_FIRSTSIDEONLY, key); 
				continue;

			case NAME_blockprojectiles:
				Flag(ld->flags, ML_BLOCKPROJECTILE, key); 
				continue;

			case NAME_blockuse:
				Flag(ld->flags, ML_BLOCKUSE, key); 
				continue;

			case NAME_blocksight:
				Flag(ld->flags, ML_BLOCKSIGHT, key); 
				continue;
			
			case NAME_blockhitscan:
				Flag(ld->flags, ML_BLOCKHITSCAN, key); 
				continue;
			
			// [TP] Locks the special with a key
			case NAME_Locknumber:
				ld->locknumber = CheckInt(key);
				continue;

			// [TP] Causes a 3d midtex to behave like an impassible line
			case NAME_Midtex3dimpassible:
				Flag(ld->flags, ML_3DMIDTEX_IMPASS, key);
				continue;

			case NAME_MoreIds:
				// delay parsing of the tag string until parsing of the sector is complete
				// This ensures that the ID is always the first tag in the list.
				tagstring = CheckString(key);
				break;


			default:
				break;
			}


			if ((namespace_bits & (Zd | Zdt)) && !strnicmp("user_", key.GetChars(), 5))
			{
				AddUserKey(key, UDMF_Line, index);
			}
		}

		if (tagstring.IsNotEmpty())
		{
			FScanner sc;
			sc.OpenString("tagstring", tagstring);
			// scan the string as long as valid numbers can be found
			while (sc.CheckNumber())
			{
				if (sc.Number != 0)	tagManager.AddLineID(index, sc.Number);
			}
		}

		if (isTranslated)
		{
			int saved = ld->flags;

			maplinedef_t mld;
			memset(&mld, 0, sizeof(mld));
			mld.special = ld->special;
			mld.tag = ld->args[0];
			P_TranslateLineDef(ld, &mld);
			ld->flags = saved | (ld->flags&(ML_MONSTERSCANACTIVATE|ML_REPEAT_SPECIAL|ML_FIRSTSIDEONLY));
		}
		if (passuse && (ld->activation & SPAC_Use)) 
		{
			ld->activation = (ld->activation & ~SPAC_Use) | SPAC_UseThrough;
		}
		if (strifetrans && ld->alpha == 1.)
		{
			ld->alpha = 0.75;
		}
		if (strifetrans2 && ld->alpha == OPAQUE)
		{
			ld->alpha = 0.25;
		}
		if (ld->sidedef[0] == NULL)
		{
			ld->sidedef[0] = (side_t*)(intptr_t)(1);
			Printf("Line %d has no first side.\n", index);
		}
		if (arg0str.IsNotEmpty() && (P_IsACSSpecial(ld->special) || ld->special == 0))
		{
			ld->args[0] = -FName(arg0str);
		}
		if (arg1str.IsNotEmpty() && (P_IsThingSpecial(ld->special) || ld->special == 0))
		{
			ld->args[1] = -FName(arg1str);
		}
		if ((ld->flags & ML_3DMIDTEX_IMPASS) && !(ld->flags & ML_3DMIDTEX)) // [TP]
		{
			Printf ("Line %d has midtex3dimpassible without midtex3d.\n", index);
		}
	}